

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_fixed.cc
# Opt level: O3

bool absl::time_internal::cctz::FixedOffsetFromName(string *name,seconds *offset)

{
  char cVar1;
  long *plVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (name,"UTC");
  if ((iVar3 == 0) ||
     (iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(name,"UTC0"), iVar3 == 0)) {
    lVar6 = 0;
  }
  else {
    if (((((name->_M_string_length != 0x12) ||
          (plVar2 = (long *)(name->_M_dataplus)._M_p,
          (char)plVar2[1] != 'C' || *plVar2 != 0x54552f6465786946)) ||
         ((cVar1 = *(char *)((long)plVar2 + 9), cVar1 != '-' && (cVar1 != '+')))) ||
        ((((*(char *)((long)plVar2 + 0xc) != ':' || (*(char *)((long)plVar2 + 0xf) != ':')) ||
          (iVar3 = anon_unknown_0::Parse02d((char *)((long)plVar2 + 10)), iVar3 == -1)) ||
         ((iVar4 = anon_unknown_0::Parse02d((char *)((long)plVar2 + 0xd)), iVar4 == -1 ||
          (iVar5 = anon_unknown_0::Parse02d((char *)(plVar2 + 2)), iVar5 == -1)))))) ||
       (iVar5 = iVar5 + (iVar4 + iVar3 * 0x3c) * 0x3c, 0x15180 < iVar5)) {
      return false;
    }
    iVar3 = -iVar5;
    if (cVar1 != '-') {
      iVar3 = iVar5;
    }
    lVar6 = (long)iVar3;
  }
  offset->__r = lVar6;
  return true;
}

Assistant:

bool FixedOffsetFromName(const std::string& name, seconds* offset) {
  if (name == "UTC" || name == "UTC0") {
    *offset = seconds::zero();
    return true;
  }

  const std::size_t prefix_len = sizeof(kFixedZonePrefix) - 1;
  const char* const ep = kFixedZonePrefix + prefix_len;
  if (name.size() != prefix_len + 9)  // <prefix>+99:99:99
    return false;
  if (!std::equal(kFixedZonePrefix, ep, name.begin())) return false;
  const char* np = name.data() + prefix_len;
  if (np[0] != '+' && np[0] != '-') return false;
  if (np[3] != ':' || np[6] != ':')  // see note below about large offsets
    return false;

  int hours = Parse02d(np + 1);
  if (hours == -1) return false;
  int mins = Parse02d(np + 4);
  if (mins == -1) return false;
  int secs = Parse02d(np + 7);
  if (secs == -1) return false;

  secs += ((hours * 60) + mins) * 60;
  if (secs > 24 * 60 * 60) return false;  // outside supported offset range
  *offset = seconds(secs * (np[0] == '-' ? -1 : 1));  // "-" means west
  return true;
}